

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_filters.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined2 uVar1;
  undefined2 uVar2;
  uchar *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint32_t uVar6;
  uint8_t uVar7;
  ostream *poVar8;
  imageException *this;
  allocator local_b1;
  Image local_b0;
  string local_88;
  Image filtered;
  string filePath;
  
  std::__cxx11::string::string((string *)&filePath,"lena.bmp",(allocator *)&local_b0);
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&filePath);
  }
  Bitmap_Operation::Load(&local_b0,&filePath);
  if (local_b0._data != (uchar *)0x0) {
    if (local_b0._colorCount != '\x01') {
      Image_Function::ConvertToGrayScale(&filtered,&local_b0);
      uVar7 = filtered._type;
      uVar6 = filtered._rowSize;
      uVar4 = filtered._8_8_;
      puVar3 = local_b0._data;
      uVar1 = local_b0._16_2_;
      filtered._width = local_b0._width;
      filtered._height = local_b0._height;
      uVar5 = filtered._8_8_;
      filtered._width = (uint32_t)uVar4;
      filtered._height = SUB84(uVar4,4);
      local_b0._width = filtered._width;
      local_b0._height = filtered._height;
      local_b0._colorCount = filtered._colorCount;
      local_b0._alignment = filtered._alignment;
      uVar2 = local_b0._16_2_;
      local_b0._colorCount = (uint8_t)uVar1;
      local_b0._alignment = SUB21(uVar1,1);
      filtered._colorCount = local_b0._colorCount;
      filtered._alignment = local_b0._alignment;
      filtered._rowSize = local_b0._rowSize;
      local_b0._rowSize = uVar6;
      local_b0._data = filtered._data;
      filtered._data = puVar3;
      filtered._type = local_b0._type;
      local_b0._type = uVar7;
      local_b0._16_2_ = uVar2;
      filtered._8_8_ = uVar5;
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&filtered);
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (&filtered,local_b0._width,local_b0._height,'\x01','\x01');
    Image_Function::Median(&local_b0,&filtered,3);
    std::__cxx11::string::string((string *)&local_88,"median.bmp",&local_b1);
    Bitmap_Operation::Save(&local_88,&filtered);
    std::__cxx11::string::~string((string *)&local_88);
    Image_Function::Prewitt(&local_b0,&filtered);
    std::__cxx11::string::string((string *)&local_88,"prewitt.bmp",&local_b1);
    Bitmap_Operation::Save(&local_88,&filtered);
    std::__cxx11::string::~string((string *)&local_88);
    Image_Function::Sobel(&local_b0,&filtered);
    std::__cxx11::string::string((string *)&local_88,"sobel.bmp",&local_b1);
    Bitmap_Operation::Save(&local_88,&filtered);
    std::__cxx11::string::~string((string *)&local_88);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&filtered);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_b0);
    std::__cxx11::string::~string((string *)&filePath);
    poVar8 = std::operator<<((ostream *)&std::cout,"Application ended correctly.");
    std::endl<char,std::char_traits<char>>(poVar8);
    return 0;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_88,"Cannot load ",&local_b1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filtered,
                 &local_88,&filePath);
  imageException::imageException(this,(string *)&filtered);
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    // This example application is made to show how filters work and what which results they produce

    try // <---- do not forget to put your code into try.. catch block!
    {
       std::string filePath = "lena.bmp"; // default image path
        if ( argc > 1 ) // Check input data
            filePath = argv[1];

        // Load an image
        PenguinV_Image::Image image = Bitmap_Operation::Load( filePath );

        // If the image is empty it means that the image doesn't exist or the file is not readable
        if( image.empty() )
            throw imageException( std::string("Cannot load ") + filePath );

        // Convert to gray-scale image if it's not
        if( image.colorCount() != PenguinV_Image::GRAY_SCALE )
            image = Image_Function::ConvertToGrayScale( image );

        // Create Image object which will contain filtered image
        PenguinV_Image::Image filtered( image.width(), image.height() );

        // Median filtering
        Image_Function::Median( image, filtered, 3 );
        Bitmap_Operation::Save( "median.bmp", filtered );

        // Prewitt filtering
        Image_Function::Prewitt( image, filtered );
        Bitmap_Operation::Save( "prewitt.bmp", filtered );

        // Sobel filtering
        Image_Function::Sobel( image, filtered );
        Bitmap_Operation::Save( "sobel.bmp", filtered );
    }
    catch( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}